

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O3

void __thiscall
deqp::gls::VarSpec::set<3,3>
          (VarSpec *this,Matrix<float,_3,_3> *minValue_,Matrix<float,_3,_3> *maxValue_)

{
  DataType DVar1;
  undefined8 *puVar2;
  int col;
  long lVar3;
  long lVar4;
  Array<float,_9> data;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  float local_1c;
  
  DVar1 = glu::getDataTypeMatrix(3,3);
  this->type = DVar1;
  puVar2 = &local_3c;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar2 + lVar4) =
           *(undefined4 *)
            ((long)((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)minValue_)->m_data)->
                   m_data[0].m_data + lVar4);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    lVar3 = lVar3 + 1;
    minValue_ = (Matrix<float,_3,_3> *)((long)minValue_ + 0xc);
    puVar2 = (undefined8 *)((long)puVar2 + 0xc);
  } while (lVar3 != 3);
  puVar2 = &local_3c;
  (this->minValue).f[8] = local_1c;
  *(undefined8 *)((long)&this->minValue + 0x10) = local_2c;
  *(undefined8 *)((long)&this->minValue + 0x18) = uStack_24;
  *(undefined8 *)&this->minValue = local_3c;
  *(undefined8 *)((long)&this->minValue + 8) = uStack_34;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar2 + lVar4) =
           *(undefined4 *)
            ((long)((Vector<tcu::Vector<float,_3>,_3> *)((Vector<float,_3> *)maxValue_)->m_data)->
                   m_data[0].m_data + lVar4);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xc);
    lVar3 = lVar3 + 1;
    maxValue_ = (Matrix<float,_3,_3> *)((long)maxValue_ + 0xc);
    puVar2 = (undefined8 *)((long)puVar2 + 0xc);
  } while (lVar3 != 3);
  (this->maxValue).f[8] = local_1c;
  *(undefined8 *)((long)&this->maxValue + 0x10) = local_2c;
  *(undefined8 *)((long)&this->maxValue + 0x18) = uStack_24;
  *(undefined8 *)&this->maxValue = local_3c;
  *(undefined8 *)((long)&this->maxValue + 8) = uStack_34;
  return;
}

Assistant:

void set (const tcu::Matrix<float, ValRows, ValCols>& minValue_, const tcu::Matrix<float, ValRows, ValCols>& maxValue_)
	{
		type = glu::getDataTypeMatrix(ValCols, ValRows);
		matToArr(minValue_, minValue.f);
		matToArr(maxValue_, maxValue.f);
	}